

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::CheckXFB
          (AttributeBindingDivisorTest *this,GLuint count,GLint *expected,GLchar *log_message)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  long lVar5;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  GLuint i_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  MessageBuilder local_268;
  string local_e8;
  string local_c8;
  uint local_a8;
  allocator<char> local_a1;
  GLuint j;
  string result_str;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string expected_str;
  GLuint i;
  GLint *result;
  bool is_ok;
  Functions *gl;
  GLchar *log_message_local;
  GLint *expected_local;
  AttributeBindingDivisorTest *pAStack_10;
  GLuint count_local;
  AttributeBindingDivisorTest *this_local;
  long lVar4;
  
  gl = (Functions *)log_message;
  log_message_local = (GLchar *)expected;
  expected_local._4_4_ = count;
  pAStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  result._7_1_ = true;
  lVar5 = (**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd41);
  expected_str.field_2._12_4_ = 0;
  while( true ) {
    if (expected_local._4_4_ <= (uint)expected_str.field_2._12_4_) goto LAB_0120074b;
    if (*(int *)(log_message_local + (ulong)(uint)expected_str.field_2._12_4_ * 4) !=
        *(int *)(lVar5 + (ulong)(uint)expected_str.field_2._12_4_ * 4)) break;
    expected_str.field_2._12_4_ = expected_str.field_2._12_4_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"[",&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&j,"[",&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  uVar7 = extraout_RDX;
  for (local_a8 = 0; local_a8 < expected_local._4_4_; local_a8 = local_a8 + 1) {
    Utilities::itoa_abi_cxx11_
              (&local_c8,(Utilities *)(ulong)*(uint *)(log_message_local + (ulong)local_a8 * 4),
               (GLuint)uVar7);
    std::__cxx11::string::append((string *)local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    Utilities::itoa_abi_cxx11_
              (&local_e8,(Utilities *)(ulong)*(uint *)(lVar5 + (ulong)local_a8 * 4),i_00);
    std::__cxx11::string::append((string *)&j);
    std::__cxx11::string::~string((string *)&local_e8);
    if (local_a8 < expected_local._4_4_ - 1) {
      std::__cxx11::string::append(local_68);
      std::__cxx11::string::append((char *)&j);
      uVar7 = extraout_RDX_00;
    }
    else {
      std::__cxx11::string::append(local_68);
      std::__cxx11::string::append((char *)&j);
      uVar7 = extraout_RDX_01;
    }
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_268,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_268,(char (*) [11])"Result is ");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j
                     );
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a6afaf);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])" was expected. ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&gl);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_268);
  result._7_1_ = false;
  std::__cxx11::string::~string((string *)&j);
  std::__cxx11::string::~string((string *)local_68);
LAB_0120074b:
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd67);
  return result._7_1_;
}

Assistant:

bool AttributeBindingDivisorTest::CheckXFB(const glw::GLuint count, const glw::GLint expected[],
										   const glw::GLchar* log_message)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result setup */
	bool is_ok = true;

	/* Result query. */
	glw::GLint* result = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	/* Check result and return. */
	for (glw::GLuint i = 0; i < count; ++i)
	{
		if (expected[i] != result[i])
		{
			std::string expected_str = "[";
			std::string result_str   = "[";

			for (glw::GLuint j = 0; j < count; ++j)
			{
				expected_str.append(Utilities::itoa((glw::GLuint)expected[j]));
				result_str.append(Utilities::itoa((glw::GLuint)result[j]));

				if (j < count - 1)
				{
					expected_str.append(", ");
					result_str.append(", ");
				}
				else
				{
					expected_str.append("]");
					result_str.append("]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result is " << result_str << ", but "
												<< expected_str << " was expected. " << log_message
												<< tcu::TestLog::EndMessage;

			is_ok = false;
			break;
		}
	}

	/* Unmaping GL buffer. */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}